

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int supsmu_(int *n,double *x,double *y,double *w,int *iper,double *span,double *alpha,double *smo,
           double *sc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_c0;
  double vsmlsq;
  double resmin;
  double scale;
  double dStack_a0;
  int jper;
  double sy;
  double sw;
  int j;
  int i__;
  double h__;
  double f;
  double a;
  double d__2;
  double d__1;
  double r__2;
  double r__1;
  int local_48;
  int i__1;
  int sc_offset;
  int sc_dim1;
  double *span_local;
  int *iper_local;
  double *w_local;
  double *y_local;
  double *x_local;
  int *n_local;
  
  i__1 = *n;
  iVar2 = i__1 + 1;
  iper_local = (int *)(w + -1);
  w_local = y + -1;
  y_local = x + -1;
  if (y_local[*n] < *x || y_local[*n] == *x) {
    dStack_a0 = 0.0;
    sy = 0.0;
    for (sw._0_4_ = 1; sw._0_4_ <= *n; sw._0_4_ = sw._0_4_ + 1) {
      dStack_a0 = *(double *)((long)iper_local + (long)sw._0_4_ * 8) * w_local[sw._0_4_] + dStack_a0
      ;
      sy = *(double *)((long)iper_local + (long)sw._0_4_ * 8) + sy;
    }
    f = 0.0;
    if (0.0 < sy) {
      f = dStack_a0 / sy;
    }
    iVar2 = *n;
    for (sw._0_4_ = 1; sw._0_4_ <= iVar2; sw._0_4_ = sw._0_4_ + 1) {
      smo[(long)sw._0_4_ + -1] = f;
    }
  }
  else {
    sw._4_4_ = *n / 4;
    sw._0_4_ = sw._4_4_ * 3;
    resmin = y_local[sw._0_4_] - y_local[sw._4_4_];
    while (resmin <= 0.0) {
      if (sw._0_4_ < *n) {
        sw._0_4_ = sw._0_4_ + 1;
      }
      if (1 < sw._4_4_) {
        sw._4_4_ = sw._4_4_ + -1;
      }
      resmin = y_local[sw._0_4_] - y_local[sw._4_4_];
    }
    r__2 = consts_.e_1[2] * resmin;
    local_c0 = r__2 * r__2;
    scale._4_4_ = *iper;
    if ((*iper == 2) && ((*x <= 0.0 && *x != 0.0 || (1.0 < y_local[*n])))) {
      scale._4_4_ = 1;
    }
    if ((scale._4_4_ < 1) || (2 < scale._4_4_)) {
      scale._4_4_ = 1;
    }
    local_48 = iVar2;
    _sc_offset = span;
    span_local = (double *)iper;
    x_local = (double *)n;
    if (0.0 < *span) {
      smooth_(n,x,y,w,span,(int *)((long)&scale + 4),&local_c0,smo,sc + ((long)iVar2 - (long)iVar2))
      ;
    }
    else {
      for (sw._4_4_ = 1; sw._4_4_ < 4; sw._4_4_ = sw._4_4_ + 1) {
        smooth_((int *)x_local,y_local + 1,w_local + 1,(double *)(iper_local + 2),
                spans_.e_1 + (sw._4_4_ + -1),(int *)((long)&scale + 4),&local_c0,
                sc + ((long)((sw._4_4_ * 2 + -1) * i__1 + 1) - (long)iVar2),
                sc + ((long)(i__1 * 7 + 1) - (long)iVar2));
        r__1._4_4_ = -scale._4_4_;
        smooth_((int *)x_local,y_local + 1,sc + ((long)(i__1 * 7 + 1) - (long)iVar2),
                (double *)(iper_local + 2),spans_.e_1 + 1,(int *)((long)&r__1 + 4),&local_c0,
                sc + ((long)(sw._4_4_ * 2 * i__1 + 1) - (long)iVar2),(double *)&j);
      }
      r__1._4_4_ = *(int *)x_local;
      for (sw._0_4_ = 1; sw._0_4_ <= r__1._4_4_; sw._0_4_ = sw._0_4_ + 1) {
        vsmlsq = consts_.e_1[0];
        for (sw._4_4_ = 1; sw._4_4_ < 4; sw._4_4_ = sw._4_4_ + 1) {
          if (sc[(long)(sw._0_4_ + sw._4_4_ * 2 * i__1) - (long)iVar2] < vsmlsq) {
            vsmlsq = sc[(long)(sw._0_4_ + sw._4_4_ * 2 * i__1) - (long)iVar2];
            sc[(long)(sw._0_4_ + i__1 * 7) - (long)iVar2] = spans_.e_1[sw._4_4_ + -1];
          }
        }
        if ((((0.0 < *alpha) && (*alpha <= 10.0)) &&
            (vsmlsq < sc[(long)(sw._0_4_ + i__1 * 6) - (long)iVar2])) && (0.0 < vsmlsq)) {
          r__2 = consts_.e_1[1];
          d__1 = vsmlsq / sc[(long)(sw._0_4_ + i__1 * 6) - (long)iVar2];
          d__2 = pmax(consts_.e_1[1],d__1);
          a = 10.0 - *alpha;
          dVar4 = spans_.e_1[2] - sc[(long)(sw._0_4_ + i__1 * 7) - (long)iVar2];
          dVar5 = pow(d__2,a);
          lVar3 = (long)(sw._0_4_ + i__1 * 7);
          sc[lVar3 - iVar2] = dVar4 * dVar5 + sc[lVar3 - iVar2];
        }
      }
      r__1._4_4_ = -scale._4_4_;
      smooth_((int *)x_local,y_local + 1,sc + ((long)(i__1 * 7 + 1) - (long)iVar2),
              (double *)(iper_local + 2),spans_.e_1 + 1,(int *)((long)&r__1 + 4),&local_c0,
              sc + ((long)(i__1 * 2 + 1) - (long)iVar2),(double *)&j);
      iVar1 = *(int *)x_local;
      for (sw._0_4_ = 1; sw._0_4_ <= iVar1; sw._0_4_ = sw._0_4_ + 1) {
        if (sc[(long)(sw._0_4_ + i__1 * 2) - (long)iVar2] <= spans_.e_1[0]) {
          sc[(long)(sw._0_4_ + i__1 * 2) - (long)iVar2] = spans_.e_1[0];
        }
        if (spans_.e_1[2] <= sc[(long)(sw._0_4_ + i__1 * 2) - (long)iVar2]) {
          sc[(long)(sw._0_4_ + i__1 * 2) - (long)iVar2] = spans_.e_1[2];
        }
        dVar4 = sc[(long)(sw._0_4_ + i__1 * 2) - (long)iVar2] - spans_.e_1[1];
        if (dVar4 < 0.0) {
          h__ = -dVar4 / (spans_.e_1[1] - spans_.e_1[0]);
          sc[(long)(sw._0_4_ + i__1 * 4) - (long)iVar2] =
               (1.0 - h__) * sc[(long)(sw._0_4_ + i__1 * 3) - (long)iVar2] +
               h__ * sc[(long)(sw._0_4_ + i__1) - (long)iVar2];
        }
        else {
          h__ = dVar4 / (spans_.e_1[2] - spans_.e_1[1]);
          sc[(long)(sw._0_4_ + i__1 * 4) - (long)iVar2] =
               (1.0 - h__) * sc[(long)(sw._0_4_ + i__1 * 3) - (long)iVar2] +
               h__ * sc[(long)(sw._0_4_ + i__1 * 5) - (long)iVar2];
        }
      }
      r__1._4_4_ = -scale._4_4_;
      smooth_((int *)x_local,y_local + 1,sc + ((long)(i__1 * 4 + 1) - (long)iVar2),
              (double *)(iper_local + 2),spans_.e_1,(int *)((long)&r__1 + 4),&local_c0,smo,
              (double *)&j);
    }
  }
  return 0;
}

Assistant:

static int supsmu_(int *n, double *x, double *y, double *w, int *iper, double *span, double *alpha, double *smo, double *sc)
{
    /* System generated locals */
    int sc_dim1, sc_offset, i__1;
    double r__1, r__2;
    double d__1, d__2;

    /* Local variables */
    double a, f, h__;
    int i__, j;
    double sw, sy;
    int jper;
    double scale, resmin;
    double vsmlsq;


/* ------------------------------------------------------------------ */

/* super-smoother. */

/* Friedman J.H. (1984). A variable span smoother. Department of Statistics, */
/*    Stanford University, Technical Report LCS5. */

/* version 10/10/84. */

/* coded  and copyright (c) 1984 by: */

/*                        Jerome H. Friedman */
/*                     Department of Statistics */
/*                               and */
/*                Stanford Linear Accelerator Center */
/*                        Stanford University */

/* all rights reserved. */


/* input: */
/*    n : number of observations (x,y - pairs). */
/*    x(n) : ordered abscissa values. */
/*    y(n) : corresponding ordinate (response) values. */
/*    w(n) : weight for each (x,y) observation. */
/*    iper : periodic variable flag. */
/*       iper=1 => x is ordered interval variable. */
/*       iper=2 => x is a periodic variable with values */
/*                 in the range (0.0,1.0) and period 1.0. */
/*    span : smoother span (fraction of observations in window). */
/*           span=0.0 => automatic (variable) span selection. */
/*    alpha : controles high frequency (small span) penality */
/*            used with automatic span selection (bass tone control). */
/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.) */
/* output: */
/*   smo(n) : smoothed ordinate (response) values. */
/* scratch: */
/*   sc(n,7) : internal working storage. */

/* note: */
/*    for small samples (n < 40) or if there are substantial serial */
/*    correlations between obserations close in x - value, then */
/*    a prespecified fixed span smoother (span > 0) should be */
/*    used. reasonable span values are 0.2 to 0.4. */

/* ------------------------------------------------------------------ */

    /* Parameter adjustments */
    sc_dim1 = *n;
    sc_offset = 1 + sc_dim1;
    sc -= sc_offset;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    if (x[*n] > x[1]) {
	goto L30;
    }
    sy = 0.0;
    sw = sy;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sy += w[j] * y[j];
	sw += w[j];
/* L10: */
    }
    a = 0.0;
    if (sw > 0.0) {
	a = sy / sw;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	smo[j] = a;
/* L20: */
    }
    return 0;
L30:
    i__ = *n / 4;
    j = i__ * 3;
    scale = x[j] - x[i__];
L40:
    if (scale > 0.f) {
	goto L50;
    }
    if (j < *n) {
	++j;
    }
    if (i__ > 1) {
	--i__;
    }
    scale = x[j] - x[i__];
    goto L40;
L50:
/* Computing 2nd power */
    r__1 = consts_1.eps * scale;
    vsmlsq = r__1 * r__1;
    jper = *iper;
    if (*iper == 2 && (x[1] < 0.0 || x[*n] > 1.0)) {
	jper = 1;
    }
    if (jper < 1 || jper > 2) {
	jper = 1;
    }
    if (*span <= 0.0) {
	goto L60;
    }
    smooth_(n, &x[1], &y[1], &w[1], span, &jper, &vsmlsq, &smo[1], &sc[
	    sc_offset]);
    return 0;
L60:
    for (i__ = 1; i__ <= 3; ++i__) {
	smooth_(n, &x[1], &y[1], &w[1], &spans_1.spans[i__ - 1], &jper, &
		vsmlsq, &sc[((i__ << 1) - 1) * sc_dim1 + 1], &sc[sc_dim1 * 7 
		+ 1]);
	i__1 = -jper;
	smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &
		i__1, &vsmlsq, &sc[(i__ << 1) * sc_dim1 + 1], &h__);
/* L70: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	resmin = consts_1.big;
	for (i__ = 1; i__ <= 3; ++i__) {
	    if (sc[j + (i__ << 1) * sc_dim1] >= resmin) {
		goto L80;
	    }
	    resmin = sc[j + (i__ << 1) * sc_dim1];
	    sc[j + sc_dim1 * 7] = spans_1.spans[i__ - 1];
L80:
	    ;
	}
	if (*alpha > 0.f && *alpha <= 10.f && resmin < sc[j + sc_dim1 * 6] && 
		resmin > 0.f) {
/* Computing MAX */
	    r__1 = consts_1.sml, r__2 = resmin / sc[j + sc_dim1 * 6];
	    d__1 = (double) pmax(r__1,r__2);
	    d__2 = (double) (10.0 - *alpha);
	    sc[j + sc_dim1 * 7] += (spans_1.spans[2] - sc[j + sc_dim1 * 7]) * 
		    pow(d__1, d__2);
	}
/* L90: */
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &i__1, &
	    vsmlsq, &sc[(sc_dim1 << 1) + 1], &h__);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (sc[j + (sc_dim1 << 1)] <= spans_1.spans[0]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[0];
	}
	if (sc[j + (sc_dim1 << 1)] >= spans_1.spans[2]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[2];
	}
	f = sc[j + (sc_dim1 << 1)] - spans_1.spans[1];
	if (f >= 0.f) {
	    goto L100;
	}
	f = -f / (spans_1.spans[1] - spans_1.spans[0]);
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1];
	goto L110;
L100:
	f /= spans_1.spans[2] - spans_1.spans[1];
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1 * 5];
L110:
	;
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[(sc_dim1 << 2) + 1], &w[1], spans_1.spans, &i__1, &
	    vsmlsq, &smo[1], &h__);
    return 0;
}